

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitsphere.cpp
# Opt level: O3

float computeBoundingSphere(uint vcount,float *points,float *center)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [64];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float fVar35;
  undefined1 auVar36 [64];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  int iVar42;
  undefined1 auVar43 [16];
  
  bVar7 = false;
  bVar8 = vcount == 0;
  if (bVar8) {
    auVar26 = ZEXT464(0xccbebc20);
    auVar29 = ZEXT464(0x4cbebc20);
    auVar28 = auVar29._0_16_;
    auVar30 = ZEXT1664(auVar28);
    auVar11 = auVar26._0_16_;
    auVar32 = ZEXT1664(auVar11);
    auVar36 = ZEXT1664(auVar11);
    auVar12 = auVar28;
    auVar38 = auVar28;
    auVar43 = auVar28;
    auVar15 = auVar28;
    auVar17 = auVar11;
    auVar13 = auVar11;
    auVar10 = auVar11;
    auVar40 = auVar28;
    auVar9 = auVar11;
    auVar16 = auVar11;
    auVar14 = auVar28;
  }
  else {
    auVar33 = ZEXT464(0x4cbebc20);
    auVar34 = ZEXT464(0xccbebc20);
    uVar4 = (ulong)vcount * 3;
    bVar7 = false;
    uVar5 = 0;
    bVar8 = true;
    auVar16 = auVar34._0_16_;
    auVar14 = auVar33._0_16_;
    auVar41 = ZEXT1664(auVar14);
    auVar39 = ZEXT1664(auVar14);
    auVar36 = ZEXT1664(auVar16);
    auVar32 = ZEXT1664(auVar16);
    auVar26 = ZEXT1664(auVar16);
    auVar30 = ZEXT1664(auVar14);
    auVar29 = ZEXT1664(auVar14);
    auVar13 = auVar16;
    auVar10 = auVar16;
    auVar9 = auVar16;
    auVar11 = auVar16;
    do {
      uVar6 = uVar5 & 0xffffffff;
      auVar28 = vucomiss_avx512f(ZEXT416((uint)points[uVar6]));
      if (!bVar7 && !bVar8) {
        auVar30 = ZEXT464((uint)points[uVar6 + 1]);
        auVar29 = ZEXT464((uint)points[uVar6 + 2]);
        auVar28 = ZEXT416((uint)points[uVar6]);
      }
      auVar12 = vucomiss_avx512f(auVar36._0_16_);
      auVar43 = ZEXT416((uint)points[uVar6 + 1]);
      if (!bVar7 && !bVar8) {
        auVar26 = ZEXT464((uint)points[uVar6 + 2]);
        auVar32 = ZEXT1664(auVar43);
        auVar36 = ZEXT1664(auVar12);
      }
      auVar38 = vucomiss_avx512f(auVar43);
      if (!bVar7 && !bVar8) {
        auVar39 = ZEXT464((uint)points[uVar6 + 2]);
        auVar41 = ZEXT1664(auVar12);
        auVar38 = auVar43;
      }
      auVar40 = auVar41._0_16_;
      auVar43 = auVar39._0_16_;
      fVar25 = points[uVar6 + 2];
      auVar17 = vucomiss_avx512f(auVar9);
      auVar9 = vmaxss_avx512f(auVar17,auVar9);
      bVar2 = !bVar7;
      bVar3 = !bVar8;
      iVar42 = auVar12._0_4_;
      auVar10._0_4_ = (uint)(bVar2 && bVar3) * iVar42 + (uint)(!bVar2 || !bVar3) * auVar10._0_4_;
      auVar12 = vucomiss_avx512f(ZEXT416((uint)fVar25));
      auVar11._0_4_ =
           (uint)(bVar2 && bVar3) * (int)fVar25 + (uint)(!bVar2 || !bVar3) * auVar11._0_4_;
      auVar12 = vminss_avx512f(ZEXT416((uint)fVar25),auVar12);
      bVar2 = !bVar7;
      bVar3 = !bVar8;
      auVar15 = vucomiss_avx512f(auVar13);
      auVar13 = vmaxss_avx512f(auVar15,auVar13);
      auVar14._0_4_ =
           (uint)(bVar2 && bVar3) * auVar17._0_4_ + (uint)(!bVar2 || !bVar3) * auVar14._0_4_;
      auVar15._4_12_ = auVar33._4_12_;
      auVar15._0_4_ = (uint)(bVar2 && bVar3) * iVar42 + (uint)(!bVar2 || !bVar3) * auVar33._0_4_;
      auVar33 = ZEXT1664(auVar15);
      bVar7 = !bVar7;
      bVar8 = !bVar8;
      uVar5 = uVar5 + 3;
      auVar16._0_4_ =
           (uint)(bVar7 && bVar8) * auVar17._0_4_ + (uint)(!bVar7 || !bVar8) * auVar16._0_4_;
      auVar17._4_12_ = auVar34._4_12_;
      auVar17._0_4_ = (uint)(bVar7 && bVar8) * iVar42 + (uint)(!bVar7 || !bVar8) * auVar34._0_4_;
      auVar34 = ZEXT1664(auVar17);
      bVar7 = uVar4 < uVar5;
      bVar8 = uVar4 == uVar5;
    } while (!bVar8);
  }
  auVar18 = vsubss_avx512f(auVar32._0_16_,auVar30._0_16_);
  auVar19 = vsubss_avx512f(auVar36._0_16_,auVar28);
  auVar20 = vsubss_avx512f(auVar26._0_16_,auVar29._0_16_);
  auVar21 = vsubss_avx512f(auVar11,auVar43);
  auVar22 = vsubss_avx512f(auVar17,auVar15);
  auVar23 = vsubss_avx512f(auVar13,auVar12);
  auVar18 = vmulss_avx512f(auVar18,auVar18);
  auVar18 = vfmadd231ss_avx512f(auVar18,auVar19,auVar19);
  auVar24 = vsubss_avx512f(auVar10,auVar40);
  auVar19 = vfmadd231ss_avx512f(auVar18,auVar20,auVar20);
  auVar18 = vsubss_avx512f(auVar9,auVar38);
  auVar18 = vmulss_avx512f(auVar18,auVar18);
  auVar18 = vfmadd231ss_avx512f(auVar18,auVar24,auVar24);
  auVar20 = vsubss_avx512f(auVar16,auVar14);
  auVar20 = vmulss_avx512f(auVar20,auVar20);
  vfmadd231ss_avx512f(auVar18,auVar21,auVar21);
  auVar20 = vfmadd231ss_avx512f(auVar20,auVar22,auVar22);
  auVar18 = vucomiss_avx512f(auVar19);
  vfmadd231ss_avx512f(auVar20,auVar23,auVar23);
  if (!bVar7 && !bVar8) {
    auVar29 = ZEXT1664(auVar43);
    auVar30 = ZEXT1664(auVar38);
    auVar26 = ZEXT1664(auVar11);
    auVar32 = ZEXT1664(auVar9);
    auVar36 = ZEXT1664(auVar10);
    auVar28 = auVar40;
    auVar19 = auVar18;
  }
  fVar27 = auVar29._0_4_;
  fVar25 = auVar26._0_4_;
  fVar35 = auVar36._0_4_;
  fVar31 = auVar32._0_4_;
  fVar37 = auVar30._0_4_;
  vucomiss_avx512f(auVar19);
  if (!bVar7 && !bVar8) {
    fVar27 = auVar12._0_4_;
    fVar37 = auVar14._0_4_;
    fVar25 = auVar13._0_4_;
    fVar31 = auVar16._0_4_;
    fVar35 = auVar17._0_4_;
    auVar28 = auVar15;
  }
  fVar37 = (fVar37 + fVar31) * 0.5;
  auVar30 = ZEXT464((uint)fVar37);
  fVar1 = (auVar28._0_4_ + fVar35) * 0.5;
  auVar36 = ZEXT464((uint)fVar1);
  fVar27 = (fVar27 + fVar25) * 0.5;
  auVar29 = ZEXT464((uint)fVar27);
  *center = fVar1;
  center[1] = fVar37;
  center[2] = fVar27;
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((fVar31 - fVar37) * (fVar31 - fVar37))),
                            ZEXT416((uint)(fVar35 - fVar1)),ZEXT416((uint)(fVar35 - fVar1)));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)(fVar25 - fVar27)),
                            ZEXT416((uint)(fVar25 - fVar27)));
  auVar32 = ZEXT1664(auVar28);
  auVar28 = vsqrtss_avx(auVar28,auVar28);
  auVar26 = ZEXT1664(auVar28);
  fVar25 = auVar28._0_4_;
  if (vcount != 0) {
    uVar4 = 0;
    do {
      uVar5 = uVar4 & 0xffffffff;
      fVar25 = points[uVar5 + 1] - auVar30._0_4_;
      auVar28 = ZEXT416((uint)(points[uVar5] - auVar36._0_4_));
      auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),auVar28,auVar28);
      auVar38 = ZEXT416((uint)(points[uVar5 + 2] - auVar29._0_4_));
      auVar28 = vfmadd231ss_fma(auVar28,auVar38,auVar38);
      if (auVar32._0_4_ < auVar28._0_4_) {
        auVar28 = vsqrtss_avx(auVar28,auVar28);
        fVar37 = auVar28._0_4_;
        fVar25 = (fVar37 + auVar26._0_4_) * 0.5;
        auVar26 = ZEXT464((uint)fVar25);
        fVar27 = fVar37 - fVar25;
        fVar37 = 1.0 / fVar37;
        auVar32 = ZEXT464((uint)(fVar25 * fVar25));
        auVar12 = ZEXT416((uint)fVar25);
        auVar28 = vfmadd213ss_fma(auVar36._0_16_,auVar12,ZEXT416((uint)(fVar27 * points[uVar5])));
        auVar38 = vfmadd213ss_fma(auVar30._0_16_,auVar12,ZEXT416((uint)(fVar27 * points[uVar5 + 1]))
                                 );
        auVar12 = vfmadd213ss_fma(auVar29._0_16_,auVar12,ZEXT416((uint)(fVar27 * points[uVar5 + 2]))
                                 );
        fVar25 = fVar37 * auVar28._0_4_;
        auVar36 = ZEXT464((uint)fVar25);
        fVar27 = fVar37 * auVar38._0_4_;
        auVar30 = ZEXT464((uint)fVar27);
        fVar37 = fVar37 * auVar12._0_4_;
        auVar29 = ZEXT464((uint)fVar37);
        *center = fVar25;
        center[1] = fVar27;
        center[2] = fVar37;
      }
      fVar25 = auVar26._0_4_;
      uVar4 = uVar4 + 3;
    } while ((ulong)vcount * 3 != uVar4);
  }
  return fVar25;
}

Assistant:

float computeBoundingSphere(unsigned int vcount,const float *points,float *center)
{

  float mRadius;
  float mRadius2;

	float xmin[3];
	float xmax[3];
	float ymin[3];
	float ymax[3];
	float zmin[3];
	float zmax[3];
	float dia1[3];
	float dia2[3];

  /* FIRST PASS: find 6 minima/maxima points */
  Set(xmin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(xmax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);
  Set(ymin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(ymax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);
  Set(zmin,BIGNUMBER,BIGNUMBER,BIGNUMBER);
  Set(zmax,-BIGNUMBER,-BIGNUMBER,-BIGNUMBER);

  for (unsigned i=0; i<vcount; i++)
	{
		const float *caller_p = &points[i*3];

   	if (caller_p[0]<xmin[0])
  	  Copy(xmin,caller_p); /* New xminimum point */
  	if (caller_p[0]>xmax[0])
  	  Copy(xmax,caller_p);
  	if (caller_p[1]<ymin[1])
  	  Copy(ymin,caller_p);
  	if (caller_p[1]>ymax[1])
  	  Copy(ymax,caller_p);
  	if (caller_p[2]<zmin[2])
  	  Copy(zmin,caller_p);
  	if (caller_p[2]>zmax[2])
  	  Copy(zmax,caller_p);
	}

  /* Set xspan = distance between the 2 points xmin & xmax (squared) */
  float dx = xmax[0] - xmin[0];
  float dy = xmax[1] - xmin[1];
  float dz = xmax[2] - xmin[2];
  float xspan = dx*dx + dy*dy + dz*dz;

  /* Same for y & z spans */
  dx = ymax[0] - ymin[0];
  dy = ymax[1] - ymin[1];
  dz = ymax[2] - ymin[2];
  float yspan = dx*dx + dy*dy + dz*dz;

  dx = zmax[0] - zmin[0];
  dy = zmax[1] - zmin[1];
  dz = zmax[2] - zmin[2];
  float zspan = dx*dx + dy*dy + dz*dz;

  /* Set points dia1 & dia2 to the maximally separated pair */
  Copy(dia1,xmin);
  Copy(dia2,xmax); /* assume xspan biggest */
  float maxspan = xspan;

  if (yspan>maxspan)
	{
	  maxspan = yspan;
  	Copy(dia1,ymin);
  	Copy(dia2,ymax);
	}

  if (zspan>maxspan)
	{
	  Copy(dia1,zmin);
	  Copy(dia2,zmax);
	}


  /* dia1,dia2 is a diameter of initial sphere */
  /* calc initial center */
  center[0] = (dia1[0]+dia2[0])*0.5f;
  center[1] = (dia1[1]+dia2[1])*0.5f;
  center[2] = (dia1[2]+dia2[2])*0.5f;

  /* calculate initial radius**2 and radius */

  dx = dia2[0]-center[0]; /* x component of radius vector */
  dy = dia2[1]-center[1]; /* y component of radius vector */
  dz = dia2[2]-center[2]; /* z component of radius vector */

  mRadius2 = dx*dx + dy*dy + dz*dz;
  mRadius = float(sqrt(mRadius2));

  /* SECOND PASS: increment current sphere */

	if ( 1 )
	{
		for (unsigned i=0; i<vcount; i++)
		{
			const float *caller_p = &points[i*3];

  		dx = caller_p[0]-center[0];
			dy = caller_p[1]-center[1];
  		dz = caller_p[2]-center[2];

			float old_to_p_sq = dx*dx + dy*dy + dz*dz;

  		if (old_to_p_sq > mRadius2) 	/* do r**2 test first */
			{ 	/* this point is outside of current sphere */
	  		float old_to_p = float(sqrt(old_to_p_sq));
				/* calc radius of new sphere */
  			mRadius = (mRadius + old_to_p) * 0.5f;
	  		mRadius2 = mRadius*mRadius; 	/* for next r**2 compare */
  			float old_to_new = old_to_p - mRadius;

	  		/* calc center of new sphere */

				float recip = 1.0f /old_to_p;

  			float cx = (mRadius*center[0] + old_to_new*caller_p[0]) * recip;
	  		float cy = (mRadius*center[1] + old_to_new*caller_p[1]) * recip;
				float cz = (mRadius*center[2] + old_to_new*caller_p[2]) * recip;

				Set(center,cx,cy,cz);
			}
		}
	}

  return mRadius;
}